

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  stbi_uc *psVar8;
  char *pcVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  stbi_uc *psVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  byte *pbVar26;
  stbi_uc *psVar27;
  byte *pbVar28;
  byte bVar29;
  ulong uVar30;
  byte bVar31;
  int iVar32;
  uint uVar33;
  stbi_uc *psVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  uint uVar38;
  long lVar39;
  ulong uVar40;
  long in_FS_OFFSET;
  bool bVar41;
  int local_c8;
  ulong local_60;
  ulong uVar9;
  
  bVar41 = depth == 0x10;
  uVar4 = x * out_n;
  uVar5 = uVar4 << bVar41;
  a_00 = a->s->img_n;
  lVar37 = (long)a_00;
  uVar40 = (ulong)(uint)(a_00 << bVar41);
  psVar8 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar41,0);
  a->out = psVar8;
  if (psVar8 == (stbi_uc *)0x0) {
    pcVar10 = "outofmem";
  }
  else {
    iVar6 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar6 == 0) {
      pcVar10 = "too large";
    }
    else {
      iVar6 = a_00 * x;
      uVar7 = iVar6 * depth + 7U >> 3;
      uVar9 = (ulong)uVar7;
      if ((uVar7 + 1) * y <= raw_len) {
        if (y != 0) {
          uVar7 = uVar4 - uVar7;
          if (7 < depth) {
            uVar7 = 0;
          }
          uVar24 = (ulong)uVar7;
          uVar18 = (ulong)uVar5;
          lVar23 = -uVar18;
          lVar39 = (long)(out_n << bVar41);
          uVar7 = 0 << bVar41;
          iVar11 = x - 1;
          lVar12 = uVar24 - lVar39;
          lVar25 = uVar24 - uVar18;
          uVar16 = 0;
          local_60 = (ulong)x;
          do {
            uVar15 = (ulong)uVar7;
            pbVar26 = raw + 1;
            bVar2 = *raw;
            if ((ulong)bVar2 < 5) {
              if (depth < 8) {
                uVar40 = 1;
                local_60 = uVar9;
              }
              bVar3 = bVar2;
              if (uVar16 == 0) {
                bVar3 = ""[bVar2];
              }
              psVar8 = a->out;
              iVar35 = (int)uVar40;
              if (0 < iVar35) {
                lVar19 = lVar23 + uVar15 + uVar24;
                uVar30 = 0;
                do {
                  switch(bVar3) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar31 = pbVar26[uVar30];
                    goto LAB_00150b5c;
                  case 2:
                  case 4:
                    bVar31 = psVar8[uVar30 + lVar19];
                    break;
                  case 3:
                    bVar31 = psVar8[uVar30 + lVar19] >> 1;
                    break;
                  default:
                    goto switchD_00150b42_default;
                  }
                  bVar31 = bVar31 + pbVar26[uVar30];
LAB_00150b5c:
                  psVar8[uVar30 + uVar15 + uVar24] = bVar31;
switchD_00150b42_default:
                  uVar30 = uVar30 + 1;
                } while (uVar40 != uVar30);
              }
              local_c8 = (int)uVar16;
              lVar19 = uVar5 * local_c8 + uVar24;
              if (depth == 8) {
                lVar14 = (long)out_n;
                lVar13 = lVar37;
                if (a_00 != out_n) {
                  psVar8[lVar37 + lVar19] = 0xff;
                }
LAB_00150bd4:
                pbVar26 = pbVar26 + lVar13;
              }
              else {
                if (depth == 0x10) {
                  lVar13 = (long)iVar35;
                  lVar14 = lVar39;
                  if (a_00 != out_n) {
                    (psVar8 + lVar13 + lVar19)[0] = 0xff;
                    (psVar8 + lVar13 + lVar19)[1] = 0xff;
                  }
                  goto LAB_00150bd4;
                }
                pbVar26 = raw + 2;
                lVar14 = 1;
              }
              psVar34 = psVar8 + lVar14 + lVar19;
              if (a_00 == out_n || depth < 8) {
                uVar17 = ((int)local_60 + -1) * iVar35;
                switch(bVar3) {
                case 0:
                  memcpy(psVar34,pbVar26,(long)(int)uVar17);
                  break;
                case 1:
                  if (0 < (int)uVar17) {
                    uVar30 = 0;
                    do {
                      psVar8[uVar30 + lVar14 + uVar15 + uVar24] =
                           psVar8[uVar30 + ((lVar14 + uVar15) - (long)iVar35) + uVar24] +
                           pbVar26[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar17 != uVar30);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar17) {
                    lVar19 = lVar14 + uVar15 + uVar24;
                    uVar15 = 0;
                    do {
                      psVar8[uVar15 + lVar19] = psVar8[uVar15 + lVar23 + lVar19] + pbVar26[uVar15];
                      uVar15 = uVar15 + 1;
                    } while (uVar17 != uVar15);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar17) {
                    lVar14 = lVar14 + uVar15;
                    uVar15 = 0;
                    do {
                      psVar8[uVar15 + lVar14 + uVar24] =
                           (char)((uint)psVar8[uVar15 + (lVar14 - iVar35) + uVar24] +
                                  (uint)psVar8[uVar15 + lVar14 + lVar25] >> 1) + pbVar26[uVar15];
                      uVar15 = uVar15 + 1;
                    } while (uVar17 != uVar15);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar17) {
                    lVar14 = lVar14 + uVar15;
                    uVar15 = 0;
                    do {
                      bVar3 = psVar8[uVar15 + (lVar14 - iVar35) + uVar24];
                      bVar31 = psVar8[uVar15 + lVar14 + lVar25];
                      bVar29 = psVar8[uVar15 + (lVar14 - iVar35) + lVar25];
                      iVar32 = ((uint)bVar31 + (uint)bVar3) - (uint)bVar29;
                      uVar36 = iVar32 - (uint)bVar3;
                      uVar21 = -uVar36;
                      if (0 < (int)uVar36) {
                        uVar21 = uVar36;
                      }
                      uVar38 = iVar32 - (uint)bVar31;
                      uVar36 = -uVar38;
                      if (0 < (int)uVar38) {
                        uVar36 = uVar38;
                      }
                      uVar33 = iVar32 - (uint)bVar29;
                      uVar38 = -uVar33;
                      if (0 < (int)uVar33) {
                        uVar38 = uVar33;
                      }
                      if (uVar36 <= uVar38) {
                        bVar29 = bVar31;
                      }
                      if (uVar38 < uVar21) {
                        bVar3 = bVar29;
                      }
                      if (uVar36 < uVar21) {
                        bVar3 = bVar29;
                      }
                      psVar8[uVar15 + lVar14 + uVar24] = bVar3 + pbVar26[uVar15];
                      uVar15 = uVar15 + 1;
                    } while (uVar17 != uVar15);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar17) {
                    uVar30 = 0;
                    do {
                      psVar8[uVar30 + lVar14 + uVar15 + uVar24] =
                           (psVar8[uVar30 + ((lVar14 + uVar15) - (long)iVar35) + uVar24] >> 1) +
                           pbVar26[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar17 != uVar30);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar17) {
                    uVar30 = 0;
                    do {
                      psVar8[uVar30 + lVar14 + uVar15 + uVar24] =
                           psVar8[uVar30 + ((lVar14 + uVar15) - (long)iVar35) + uVar24] +
                           pbVar26[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar17 != uVar30);
                  }
                }
                pbVar26 = pbVar26 + (int)uVar17;
              }
              else {
                if (bVar3 < 7) {
                  psVar20 = psVar8 + lVar14 + lVar23 + lVar19;
                  switch(bVar3) {
                  case 0:
                    if (iVar11 != 0) {
                      iVar32 = iVar11;
                      do {
                        if (0 < iVar35) {
                          uVar30 = 0;
                          do {
                            psVar34[uVar30] = pbVar26[uVar30];
                            uVar30 = uVar30 + 1;
                          } while (uVar40 != uVar30);
                        }
                        psVar34[iVar35] = 0xff;
                        pbVar26 = pbVar26 + iVar35;
                        psVar34 = psVar34 + lVar39;
                        iVar32 = iVar32 + -1;
                      } while (iVar32 != 0);
                    }
                    break;
                  case 1:
                    if (iVar11 != 0) {
                      psVar8 = psVar8 + lVar14 + uVar15 + lVar12;
                      iVar32 = iVar11;
                      do {
                        if (0 < iVar35) {
                          uVar30 = 0;
                          do {
                            psVar34[uVar30] = psVar8[uVar30] + pbVar26[uVar30];
                            uVar30 = uVar30 + 1;
                          } while (uVar40 != uVar30);
                        }
                        psVar34[iVar35] = 0xff;
                        pbVar26 = pbVar26 + iVar35;
                        psVar34 = psVar34 + lVar39;
                        psVar8 = psVar8 + lVar39;
                        iVar32 = iVar32 + -1;
                      } while (iVar32 != 0);
                    }
                    break;
                  case 2:
                    if (iVar11 != 0) {
                      iVar32 = iVar11;
                      do {
                        if (0 < iVar35) {
                          uVar30 = 0;
                          do {
                            psVar34[uVar30] = psVar34[uVar30 + lVar23] + pbVar26[uVar30];
                            uVar30 = uVar30 + 1;
                          } while (uVar40 != uVar30);
                        }
                        psVar34[iVar35] = 0xff;
                        pbVar26 = pbVar26 + iVar35;
                        psVar34 = psVar34 + lVar39;
                        iVar32 = iVar32 + -1;
                      } while (iVar32 != 0);
                    }
                    break;
                  case 3:
                    if (iVar11 != 0) {
                      psVar8 = psVar8 + lVar14 + uVar15 + lVar12;
                      iVar32 = iVar11;
                      do {
                        if (0 < iVar35) {
                          uVar30 = 0;
                          do {
                            psVar34[uVar30] =
                                 (char)((uint)psVar8[uVar30] + (uint)psVar20[uVar30] >> 1) +
                                 pbVar26[uVar30];
                            uVar30 = uVar30 + 1;
                          } while (uVar40 != uVar30);
                        }
                        psVar34[iVar35] = 0xff;
                        pbVar26 = pbVar26 + iVar35;
                        psVar34 = psVar34 + lVar39;
                        psVar20 = psVar20 + lVar39;
                        psVar8 = psVar8 + lVar39;
                        iVar32 = iVar32 + -1;
                      } while (iVar32 != 0);
                    }
                    break;
                  case 4:
                    if (iVar11 != 0) {
                      psVar27 = psVar8 + lVar14 + uVar15 + lVar12;
                      psVar8 = psVar8 + lVar14 + uVar15 + (lVar12 - uVar18);
                      iVar32 = iVar11;
                      do {
                        if (0 < iVar35) {
                          uVar30 = 0;
                          do {
                            bVar3 = psVar27[uVar30];
                            bVar31 = psVar20[uVar30];
                            bVar29 = psVar8[uVar30];
                            iVar22 = ((uint)bVar31 + (uint)bVar3) - (uint)bVar29;
                            uVar21 = iVar22 - (uint)bVar3;
                            uVar17 = -uVar21;
                            if (0 < (int)uVar21) {
                              uVar17 = uVar21;
                            }
                            uVar36 = iVar22 - (uint)bVar31;
                            uVar21 = -uVar36;
                            if (0 < (int)uVar36) {
                              uVar21 = uVar36;
                            }
                            uVar38 = iVar22 - (uint)bVar29;
                            uVar36 = -uVar38;
                            if (0 < (int)uVar38) {
                              uVar36 = uVar38;
                            }
                            if (uVar21 <= uVar36) {
                              bVar29 = bVar31;
                            }
                            if (uVar36 < uVar17) {
                              bVar3 = bVar29;
                            }
                            if (uVar21 < uVar17) {
                              bVar3 = bVar29;
                            }
                            psVar34[uVar30] = bVar3 + pbVar26[uVar30];
                            uVar30 = uVar30 + 1;
                          } while (uVar40 != uVar30);
                        }
                        psVar34[iVar35] = 0xff;
                        pbVar26 = pbVar26 + iVar35;
                        psVar34 = psVar34 + lVar39;
                        psVar20 = psVar20 + lVar39;
                        psVar27 = psVar27 + lVar39;
                        psVar8 = psVar8 + lVar39;
                        iVar32 = iVar32 + -1;
                      } while (iVar32 != 0);
                    }
                    break;
                  case 5:
                    if (iVar11 != 0) {
                      psVar8 = psVar8 + lVar14 + uVar15 + lVar12;
                      iVar32 = iVar11;
                      do {
                        if (0 < iVar35) {
                          uVar30 = 0;
                          do {
                            psVar34[uVar30] = (psVar8[uVar30] >> 1) + pbVar26[uVar30];
                            uVar30 = uVar30 + 1;
                          } while (uVar40 != uVar30);
                        }
                        psVar34[iVar35] = 0xff;
                        pbVar26 = pbVar26 + iVar35;
                        psVar34 = psVar34 + lVar39;
                        psVar8 = psVar8 + lVar39;
                        iVar32 = iVar32 + -1;
                      } while (iVar32 != 0);
                    }
                    break;
                  case 6:
                    if (iVar11 != 0) {
                      psVar8 = psVar8 + lVar14 + uVar15 + lVar12;
                      iVar32 = iVar11;
                      do {
                        if (0 < iVar35) {
                          uVar30 = 0;
                          do {
                            psVar34[uVar30] = psVar8[uVar30] + pbVar26[uVar30];
                            uVar30 = uVar30 + 1;
                          } while (uVar40 != uVar30);
                        }
                        psVar34[iVar35] = 0xff;
                        pbVar26 = pbVar26 + iVar35;
                        psVar34 = psVar34 + lVar39;
                        psVar8 = psVar8 + lVar39;
                        iVar32 = iVar32 + -1;
                      } while (iVar32 != 0);
                    }
                  }
                }
                if (x != 0 && depth == 0x10) {
                  psVar8 = a->out + (long)iVar35 + uVar15 + 1;
                  uVar15 = (ulong)x;
                  do {
                    *psVar8 = 0xff;
                    psVar8 = psVar8 + lVar39;
                    uVar17 = (int)uVar15 - 1;
                    uVar15 = (ulong)uVar17;
                  } while (uVar17 != 0);
                }
              }
            }
            else {
              *(char **)(in_FS_OFFSET + -0x10) = "invalid filter";
            }
            if (4 < bVar2) {
              return 0;
            }
            uVar16 = uVar16 + 1;
            uVar7 = uVar7 + uVar5;
            raw = pbVar26;
          } while (uVar16 != y);
        }
        if (7 < depth) {
          if (depth != 0x10) {
            return 1;
          }
          if (uVar4 * y != 0) {
            psVar8 = a->out;
            lVar37 = 0;
            do {
              puVar1 = (ushort *)(psVar8 + lVar37 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar37 = lVar37 + 1;
            } while (uVar4 * y != (int)lVar37);
            return 1;
          }
          return 1;
        }
        if (y == 0) {
          return 1;
        }
        uVar7 = x - 1;
        lVar37 = uVar4 - uVar9;
        lVar12 = (ulong)uVar7 + 1;
        uVar17 = 0;
        uVar40 = 0;
        do {
          bVar2 = 1;
          if (color == 0) {
            bVar2 = ""[depth];
          }
          psVar8 = a->out;
          pbVar28 = psVar8 + uVar5 * (int)uVar40;
          pbVar26 = pbVar28 + (uVar4 - uVar9);
          uVar16 = (ulong)uVar17;
          if (depth == 4) {
            iVar11 = iVar6;
            if (1 < iVar6) {
              psVar34 = psVar8 + lVar37;
              iVar35 = iVar6;
              do {
                psVar8[uVar16] = (psVar34[uVar16] >> 4) * bVar2;
                psVar8[uVar16 + 1] = (psVar34[uVar16] & 0xf) * bVar2;
                iVar11 = iVar35 + -2;
                psVar34 = psVar34 + 1;
                psVar8 = psVar8 + 2;
                bVar41 = 3 < iVar35;
                iVar35 = iVar11;
              } while (bVar41);
              pbVar26 = psVar34 + uVar16;
              pbVar28 = psVar8 + uVar16;
            }
            if (iVar11 == 1) {
              bVar3 = *pbVar26 >> 4;
LAB_001514c1:
              bVar2 = bVar3 * bVar2;
LAB_001514c4:
              *pbVar28 = bVar2;
            }
          }
          else if (depth == 2) {
            iVar11 = iVar6;
            if (3 < iVar6) {
              psVar34 = psVar8 + lVar37;
              iVar35 = iVar6;
              do {
                psVar8[uVar16] = (psVar34[uVar16] >> 6) * bVar2;
                psVar8[uVar16 + 1] = (psVar34[uVar16] >> 4 & 3) * bVar2;
                psVar8[uVar16 + 2] = (psVar34[uVar16] >> 2 & 3) * bVar2;
                psVar8[uVar16 + 3] = (psVar34[uVar16] & 3) * bVar2;
                iVar11 = iVar35 + -4;
                psVar34 = psVar34 + 1;
                psVar8 = psVar8 + 4;
                bVar41 = 7 < iVar35;
                iVar35 = iVar11;
              } while (bVar41);
              pbVar26 = psVar34 + uVar16;
              pbVar28 = psVar8 + uVar16;
            }
            if (0 < iVar11) {
              *pbVar28 = (*pbVar26 >> 6) * bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (1 < iVar11) {
              *pbVar28 = (*pbVar26 >> 4 & 3) * bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (iVar11 == 3) {
              bVar3 = *pbVar26 >> 2 & 3;
              goto LAB_001514c1;
            }
          }
          else if (depth == 1) {
            iVar11 = iVar6;
            if (7 < iVar6) {
              psVar34 = psVar8 + lVar37;
              iVar35 = iVar6;
              do {
                psVar8[uVar16] = (char)psVar34[uVar16] >> 7 & bVar2;
                psVar8[uVar16 + 1] = (char)(psVar34[uVar16] * '\x02') >> 7 & bVar2;
                psVar8[uVar16 + 2] = (char)(psVar34[uVar16] << 2) >> 7 & bVar2;
                psVar8[uVar16 + 3] = (char)(psVar34[uVar16] << 3) >> 7 & bVar2;
                psVar8[uVar16 + 4] = (char)(psVar34[uVar16] << 4) >> 7 & bVar2;
                psVar8[uVar16 + 5] = (char)(psVar34[uVar16] << 5) >> 7 & bVar2;
                psVar8[uVar16 + 6] = (char)(psVar34[uVar16] << 6) >> 7 & bVar2;
                bVar3 = bVar2;
                if ((psVar34[uVar16] & 1) == 0) {
                  bVar3 = 0;
                }
                psVar8[uVar16 + 7] = bVar3;
                iVar11 = iVar35 + -8;
                psVar34 = psVar34 + 1;
                psVar8 = psVar8 + 8;
                bVar41 = 0xf < iVar35;
                iVar35 = iVar11;
              } while (bVar41);
              pbVar26 = psVar34 + uVar16;
              pbVar28 = psVar8 + uVar16;
            }
            if (0 < iVar11) {
              *pbVar28 = (char)*pbVar26 >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (1 < iVar11) {
              *pbVar28 = (char)(*pbVar26 * '\x02') >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (2 < iVar11) {
              *pbVar28 = (char)(*pbVar26 << 2) >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (3 < iVar11) {
              *pbVar28 = (char)(*pbVar26 << 3) >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (4 < iVar11) {
              *pbVar28 = (char)(*pbVar26 << 4) >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (5 < iVar11) {
              *pbVar28 = (char)(*pbVar26 << 5) >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (iVar11 == 7) {
              bVar2 = (char)(*pbVar26 << 6) >> 7 & bVar2;
              goto LAB_001514c4;
            }
          }
          if (a_00 != out_n) {
            psVar8 = a->out;
            if (a_00 == 1) {
              lVar23 = lVar12;
              if (-1 < (int)uVar7) {
                do {
                  psVar8[lVar23 * 2 + (uVar16 - 1)] = 0xff;
                  psVar8[lVar23 * 2 + (uVar16 - 2)] = psVar8[lVar23 + (uVar16 - 1)];
                  lVar25 = lVar23 + -1;
                  bVar41 = 0 < lVar23;
                  lVar23 = lVar25;
                } while (lVar25 != 0 && bVar41);
              }
            }
            else if (-1 < (int)uVar7) {
              psVar34 = psVar8 + (ulong)uVar7 * 3 + 2 + uVar16;
              lVar23 = lVar12;
              do {
                psVar8[lVar23 * 4 + (uVar16 - 1)] = 0xff;
                psVar8[lVar23 * 4 + (uVar16 - 2)] = *psVar34;
                psVar8[lVar23 * 4 + (uVar16 - 3)] = psVar34[-1];
                psVar8[lVar23 * 4 + (uVar16 - 4)] = psVar34[-2];
                psVar34 = psVar34 + -3;
                lVar25 = lVar23 + -1;
                bVar41 = 0 < lVar23;
                lVar23 = lVar25;
              } while (lVar25 != 0 && bVar41);
            }
          }
          uVar40 = uVar40 + 1;
          uVar17 = uVar17 + uVar5;
          if (uVar40 == y) {
            return 1;
          }
        } while( true );
      }
      pcVar10 = "not enough pixels";
    }
  }
  *(char **)(in_FS_OFFSET + -0x10) = pcVar10;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }